

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  float fVar3;
  ImGuiContext *pIVar4;
  undefined4 in_EAX;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImRect local_20;
  
  pIVar4 = GImGui;
  fVar6 = (window->InnerRect).Min.x + -1.0;
  fVar7 = (window->InnerRect).Min.y + -1.0;
  fVar8 = (window->InnerRect).Max.x + 1.0;
  fVar9 = (window->InnerRect).Max.y + 1.0;
  fVar11 = (item_rect->Min).x;
  fVar12 = (item_rect->Min).y;
  fVar10 = (item_rect->Max).x;
  fVar3 = (item_rect->Max).y;
  auVar2._4_4_ = -(uint)(fVar7 <= fVar12);
  auVar2._0_4_ = -(uint)(fVar6 <= fVar11);
  auVar2._8_4_ = -(uint)(fVar10 <= fVar8);
  auVar2._12_4_ = -(uint)(fVar3 <= fVar9);
  iVar5 = movmskps(in_EAX,auVar2);
  if (iVar5 == 0xf) {
    fVar11 = 0.0;
    fVar12 = 0.0;
    goto LAB_0011b936;
  }
  if (window->ScrollbarX == true) {
    if (fVar6 <= fVar11) {
      if (fVar10 < fVar8) goto LAB_0011b8c9;
      fVar6 = 1.0;
    }
    else {
      fVar6 = 0.0;
      fVar10 = fVar11;
    }
    (window->ScrollTarget).x =
         (float)(int)((fVar10 - (window->Pos).x) + (GImGui->Style).ItemSpacing.x +
                     (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = fVar6;
  }
LAB_0011b8c9:
  if (fVar7 <= fVar12) {
    if (fVar9 <= fVar3) {
      fVar11 = (fVar3 - (window->Pos).y) + (pIVar4->Style).ItemSpacing.y;
      fVar12 = 1.0;
      goto LAB_0011b91b;
    }
  }
  else {
    fVar11 = (fVar12 - (window->Pos).y) - (pIVar4->Style).ItemSpacing.y;
    fVar12 = 0.0;
LAB_0011b91b:
    SetScrollFromPosY(window,fVar11,fVar12);
  }
  IVar1 = CalcNextScrollFromScrollTargetAndClamp(window,false);
  fVar11 = IVar1.x - (window->Scroll).x;
  fVar12 = IVar1.y - (window->Scroll).y;
LAB_0011b936:
  if ((window->Flags & 0x1000000) != 0) {
    local_20.Min.x = (item_rect->Min).x - fVar11;
    local_20.Min.y = (item_rect->Min).y - fVar12;
    local_20.Max.x = (item_rect->Max).x - fVar11;
    local_20.Max.y = (item_rect->Max).y - fVar12;
    IVar1 = ScrollToBringRectIntoView(window->ParentWindow,&local_20);
    fVar11 = fVar11 + IVar1.x;
    fVar12 = fVar12 + IVar1.y;
  }
  IVar1.y = fVar12;
  IVar1.x = fVar11;
  return IVar1;
}

Assistant:

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    ImVec2 delta_scroll;
    if (!window_rect.Contains(item_rect))
    {
        if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x + g.Style.ItemSpacing.x, 0.0f);
        else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x - window->Pos.x + g.Style.ItemSpacing.x, 1.0f);
        if (item_rect.Min.y < window_rect.Min.y)
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y - g.Style.ItemSpacing.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y - window->Pos.y + g.Style.ItemSpacing.y, 1.0f);

        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window, false);
        delta_scroll = next_scroll - window->Scroll;
    }

    // Also scroll parent window to keep us into view if necessary
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        delta_scroll += ScrollToBringRectIntoView(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll));

    return delta_scroll;
}